

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_STRIKE(effect_handler_context_t *context)

{
  loc grid1;
  _Bool _Var1;
  wchar_t dam;
  _Bool _Var2;
  source origin;
  source sVar3;
  loc target;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  target.x = (player->grid).x;
  target.y = (player->grid).y;
  if (context->dir == L'\x05') {
    _Var1 = target_okay();
    if (_Var1) {
      target_get((loc_conflict *)&target);
    }
  }
  grid1.x = (player->grid).x;
  grid1.y = (player->grid).y;
  _Var2 = false;
  _Var1 = projectable((chunk *)cave,grid1,target,L'\0');
  if (_Var1) {
    _Var1 = square_isknown(cave,target);
    _Var2 = false;
    if (_Var1) {
      sVar3 = source_player();
      origin._4_4_ = 0;
      origin.what = sVar3.what;
      origin.which.trap = sVar3.which.trap;
      _Var1 = project(origin,context->radius,target,dam,context->subtype,L'q',L'\0','\0',
                      context->obj);
      _Var2 = true;
      if (_Var1) {
        context->ident = true;
      }
    }
  }
  return _Var2;
}

Assistant:

bool effect_handler_STRIKE(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	struct loc target = player->grid;
	int flg = PROJECT_JUMP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Ask for a target; if no direction given, the player is struck  */
	if ((context->dir == DIR_TARGET) && target_okay()) {
		target_get(&target);
	}

	/* Enforce line of sight */
	if (!projectable(cave, player->grid, target, PROJECT_NONE) ||
		!square_isknown(cave, target)) {
		return false;
	}

	/* Aim at the target.  Hurt items on floor. */
	if (project(source_player(), context->radius, target, dam, context->subtype,
				flg, 0, 0, context->obj)) {
		context->ident = true;
	}

	return true;
}